

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

bool HasIntegerMembersInRange
               (ExternTypeInfo *type,uint fromOffset,uint toOffset,ExternTypeInfo *exTypes,
               ExternMemberInfo *exTypeExtra)

{
  long lVar1;
  TypeCategory TVar2;
  bool bVar3;
  ulong uVar4;
  ExternTypeInfo *type_00;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar5 = (ulong)(type->field_8).arrSize;
  bVar7 = uVar5 != 0;
  if (bVar7) {
    uVar6 = (type->field_11).subType;
    uVar4 = 1;
    do {
      TVar2 = exTypes[exTypeExtra[uVar6].type].type;
      if ((TVar2 != TYPE_DOUBLE) && (TVar2 != TYPE_FLOAT)) {
        type_00 = exTypes + exTypeExtra[uVar6].type;
        if ((TVar2 == TYPE_COMPLEX) &&
           ((type_00->subCat == CAT_CLASS && ((type_00->field_8).arrSize != 0)))) {
          bVar3 = HasIntegerMembersInRange
                            (type_00,fromOffset - exTypeExtra[uVar6].offset,
                             toOffset - exTypeExtra[uVar6].offset,exTypes,exTypeExtra);
          if (bVar3) {
            return bVar7;
          }
        }
        else if ((exTypeExtra[uVar6].offset < toOffset) &&
                (fromOffset < exTypeExtra[uVar6].offset + type_00->size)) {
          return bVar7;
        }
      }
      bVar7 = uVar4 < uVar5;
      uVar6 = uVar6 + 1;
      lVar1 = uVar4 + 1;
      uVar4 = uVar4 + 1;
    } while (lVar1 - uVar5 != 1);
  }
  return bVar7;
}

Assistant:

bool HasIntegerMembersInRange(ExternTypeInfo &type, unsigned fromOffset, unsigned toOffset, ExternTypeInfo *exTypes, ExternMemberInfo *exTypeExtra)
{
	for(unsigned m = 0; m < type.memberCount; m++)
	{
		ExternMemberInfo &member = exTypeExtra[type.memberOffset + m];

		ExternTypeInfo &memberType = exTypes[member.type];

		if(memberType.type == ExternTypeInfo::TYPE_COMPLEX)
		{
			// Handle opaque types
			bool opaqueType = memberType.subCat != ExternTypeInfo::CAT_CLASS || memberType.memberCount == 0;

			if(opaqueType)
			{
				if(member.offset + memberType.size > fromOffset && member.offset < toOffset)
					return true;
			}
			else
			{
				if(HasIntegerMembersInRange(memberType, fromOffset - member.offset, toOffset - member.offset, exTypes, exTypeExtra))
					return true;
			}
		}
		else if(memberType.type != ExternTypeInfo::TYPE_FLOAT && memberType.type != ExternTypeInfo::TYPE_DOUBLE)
		{
			if(member.offset + memberType.size > fromOffset && member.offset < toOffset)
				return true;
		}
	}

	return false;
}